

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O2

int __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateFieldMetadata
          (MessageGenerator *this,Printer *printer)

{
  uint uVar1;
  FieldGeneratorMap *field;
  ExtensionRange *args;
  FieldDescriptor *this_00;
  bool bVar2;
  Type TVar3;
  uint32_t u32;
  CppType CVar4;
  int iVar5;
  FieldGenerator *pFVar6;
  mapped_type *pmVar7;
  Descriptor *pDVar8;
  LogMessage *other;
  OneofDescriptor *pOVar9;
  undefined1 *options;
  int __c;
  ExtensionRange *range;
  FieldDescriptor *field_00;
  AlphaNum *a;
  AlphaNum *a_00;
  AlphaNum *a_01;
  AlphaNum *a_02;
  FieldDescriptor *field_01;
  AlphaNum *a_03;
  char *pcVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  uint32_t tag;
  Options *local_210;
  FieldGeneratorMap *local_208;
  Descriptor *in_stack_fffffffffffffe00;
  Formatter format;
  string ptr;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  string serializer;
  vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
  sorted_extensions;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  int type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  FieldGeneratorMap *local_b0;
  string local_a8;
  string local_88;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  sorted;
  key_type local_50;
  
  format.printer_ = printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&format.vars_._M_t,&(this->variables_)._M_t);
  iVar5 = 0;
  if ((this->options_).table_driven_serialization == true) {
    anon_unknown_0::SortFieldsByNumber(&sorted,this->descriptor_);
    local_210 = &this->options_;
    if (*(char *)(*(long *)(this->descriptor_ + 0x20) + 0x4b) == '\x01') {
      local_b0 = &this->field_generators_;
      for (lVar11 = 0; lVar11 != 2; lVar11 = lVar11 + 1) {
        field = (FieldGeneratorMap *)
                sorted.
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar11];
        pFVar6 = FieldGeneratorMap::get(local_b0,(FieldDescriptor *)field);
        iVar5 = *(int *)((long)&field->descriptor_ + 4);
        local_208 = field;
        TVar3 = FieldDescriptor::type((FieldDescriptor *)field);
        vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        uVar1 = *(uint *)(internal::WireFormatLite::kWireTypeForFieldType + (ulong)TVar3 * 4);
        vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &vars._M_t._M_impl.super__Rb_tree_header._M_header;
        vars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        QualifiedClassName_abi_cxx11_
                  (&serializer,(cpp *)this->descriptor_,(Descriptor *)local_210,
                   (Options *)internal::WireFormatLite::kWireTypeForFieldType);
        std::__cxx11::string::string((string *)&ptr,"classtype",(allocator *)&local_d0);
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&vars,&ptr);
        std::__cxx11::string::operator=((string *)pmVar7,(string *)&serializer);
        std::__cxx11::string::~string((string *)&ptr);
        std::__cxx11::string::~string((string *)&serializer);
        FieldName_abi_cxx11_(&serializer,(cpp *)local_208,field_00);
        std::__cxx11::string::string((string *)&ptr,"field_name",(allocator *)&local_d0);
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&vars,&ptr);
        std::__cxx11::string::operator=((string *)pmVar7,(string *)&serializer);
        std::__cxx11::string::~string((string *)&ptr);
        std::__cxx11::string::~string((string *)&serializer);
        strings::AlphaNum::AlphaNum((AlphaNum *)&serializer,iVar5 << 3 | uVar1);
        StrCat_abi_cxx11_(&ptr,(protobuf *)&serializer,a);
        std::__cxx11::string::string((string *)&local_d0,"tag",(allocator *)&local_110);
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&vars,&local_d0);
        std::__cxx11::string::operator=((string *)pmVar7,(string *)&ptr);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&ptr);
        strings::AlphaNum::AlphaNum((AlphaNum *)&serializer,(int)lVar11);
        StrCat_abi_cxx11_(&ptr,(protobuf *)&serializer,a_00);
        std::__cxx11::string::string((string *)&local_d0,"hasbit",(allocator *)&local_110);
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&vars,&local_d0);
        std::__cxx11::string::operator=((string *)pmVar7,(string *)&ptr);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&ptr);
        u32 = anon_unknown_0::CalcFieldNum(pFVar6,(FieldDescriptor *)local_208,local_210);
        strings::AlphaNum::AlphaNum((AlphaNum *)&serializer,u32);
        StrCat_abi_cxx11_(&ptr,(protobuf *)&serializer,a_01);
        std::__cxx11::string::string((string *)&local_d0,"type",(allocator *)&local_110);
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&vars,&local_d0);
        std::__cxx11::string::operator=((string *)pmVar7,(string *)&ptr);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&ptr);
        std::__cxx11::string::string((string *)&serializer,"ptr",(allocator *)&ptr);
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&vars,(key_type *)&serializer);
        std::__cxx11::string::assign((char *)pmVar7);
        std::__cxx11::string::~string((string *)&serializer);
        CVar4 = FieldDescriptor::cpp_type((FieldDescriptor *)local_208);
        if (CVar4 == CPPTYPE_MESSAGE) {
          pDVar8 = FieldDescriptor::message_type((FieldDescriptor *)local_208);
          if (*(char *)(*(long *)(pDVar8 + 0x20) + 0x4b) == '\x01') {
            internal::LogMessage::LogMessage
                      ((LogMessage *)&serializer,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                       ,0x870);
            other = internal::LogMessage::operator<<
                              ((LogMessage *)&serializer,
                               "CHECK failed: !IsMapEntryMessage(field->message_type()): ");
            internal::LogFinisher::operator=((LogFinisher *)&ptr,other);
            internal::LogMessage::~LogMessage((LogMessage *)&serializer);
          }
          std::__cxx11::string::string
                    ((string *)&local_88,"TableStruct",(allocator *)&sorted_extensions);
          pDVar8 = FieldDescriptor::message_type((FieldDescriptor *)local_208);
          UniqueName((string *)&type,&local_88,pDVar8,local_210);
          std::operator+(&local_110,"::",(string *)&type);
          std::operator+(&local_d0,&local_110,"::serialization_table + ");
          FieldDescriptor::message_type((FieldDescriptor *)local_208);
          iVar5 = anon_unknown_0::FindMessageIndexInFile(in_stack_fffffffffffffe00);
          strings::AlphaNum::AlphaNum((AlphaNum *)&serializer,iVar5);
          StrCat_abi_cxx11_(&local_a8,(protobuf *)&serializer,a_02);
          std::operator+(&ptr,&local_d0,&local_a8);
          std::__cxx11::string::string((string *)&local_50,"ptr",(allocator *)&tag);
          pmVar7 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](&vars,&local_50);
          std::__cxx11::string::operator=((string *)pmVar7,(string *)&ptr);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&ptr);
          std::__cxx11::string::~string((string *)&local_a8);
          std::__cxx11::string::~string((string *)&local_d0);
          std::__cxx11::string::~string((string *)&local_110);
          std::__cxx11::string::~string((string *)&type);
          std::__cxx11::string::~string((string *)&local_88);
        }
        Formatter::SaveState::SaveState((SaveState *)&serializer,&format);
        Formatter::AddMap(&format,&vars);
        Formatter::operator()<>
                  (&format,
                   "{PROTOBUF_FIELD_OFFSET(::$proto_ns$::internal::MapEntryHelper<$classtype$::SuperType>, $field_name$_), $tag$,PROTOBUF_FIELD_OFFSET(::$proto_ns$::internal::MapEntryHelper<$classtype$::SuperType>, _has_bits_) * 8 + $hasbit$, $type$, $ptr$},\n"
                  );
        Formatter::SaveState::~SaveState((SaveState *)&serializer);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(&vars._M_t);
      }
      iVar5 = 2;
    }
    else {
      Formatter::operator()<>
                (&format,"{PROTOBUF_FIELD_OFFSET($classtype$, _cached_size_), 0, 0, 0, nullptr},\n")
      ;
      sorted_extensions.
      super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      sorted_extensions.
      super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      sorted_extensions.
      super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      std::
      vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
      ::reserve(&sorted_extensions,(long)*(int *)(this->descriptor_ + 0x78));
      lVar13 = 0;
      for (lVar11 = 0; lVar11 < *(int *)(this->descriptor_ + 0x78); lVar11 = lVar11 + 1) {
        serializer._M_dataplus._M_p = (pointer)(*(long *)(this->descriptor_ + 0x48) + lVar13);
        std::
        vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>
        ::emplace_back<google::protobuf::Descriptor::ExtensionRange_const*>
                  ((vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>
                    *)&sorted_extensions,(ExtensionRange **)&serializer);
        lVar13 = lVar13 + 0x10;
      }
      std::
      sort<__gnu_cxx::__normal_iterator<google::protobuf::Descriptor::ExtensionRange_const**,std::vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>>,google::protobuf::compiler::cpp::(anonymous_namespace)::ExtensionRangeSorter>
                (sorted_extensions.
                 super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 sorted_extensions.
                 super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      local_208 = &this->field_generators_;
      lVar11 = 0;
      uVar12 = 0;
      while( true ) {
        uVar12 = (ulong)(int)uVar12;
        while( true ) {
          uVar14 = (long)sorted_extensions.
                         super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)sorted_extensions.
                         super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3;
          lVar13 = (long)sorted.
                         super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)sorted.
                         super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3;
          if ((uVar14 <= uVar12) ||
             ((args = sorted_extensions.
                      super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar12], lVar13 != lVar11 &&
              (*(int *)(sorted.
                        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar11] + 4) <= args->start))))
          break;
          Formatter::operator()
                    (&format,
                     "{PROTOBUF_FIELD_OFFSET($classtype$, _extensions_), $1$, $2$, ::$proto_ns$::internal::FieldMetadata::kSpecial, reinterpret_cast<const void*>(::$proto_ns$::internal::ExtensionSerializer)},\n"
                     ,&args->start,&args->end);
          uVar12 = uVar12 + 1;
        }
        if (lVar13 == lVar11) break;
        this_00 = sorted.
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar11];
        iVar5 = *(int *)(this_00 + 4);
        TVar3 = FieldDescriptor::type(this_00);
        options = internal::WireFormatLite::kWireTypeForFieldType;
        tag = iVar5 << 3 |
              *(uint *)(internal::WireFormatLite::kWireTypeForFieldType + (ulong)TVar3 * 4);
        bVar2 = FieldDescriptor::is_packed(this_00);
        if (bVar2) {
          tag = *(int *)(this_00 + 4) * 8 + 2;
        }
        FieldName_abi_cxx11_((string *)&vars,(cpp *)this_00,field_01);
        pOVar9 = FieldDescriptor::real_containing_oneof(this_00);
        if (pOVar9 != (OneofDescriptor *)0x0) {
          std::__cxx11::string::_M_assign((string *)&vars);
        }
        std::__cxx11::string::string((string *)&serializer,"field_name",(allocator *)&ptr);
        Formatter::Set<std::__cxx11::string>
                  (&format,&serializer,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vars);
        std::__cxx11::string::~string((string *)&serializer);
        std::__cxx11::string::string((string *)&ptr,"nullptr",(allocator *)&serializer);
        CVar4 = FieldDescriptor::cpp_type(this_00);
        if (CVar4 == CPPTYPE_MESSAGE) {
          pDVar8 = FieldDescriptor::message_type(this_00);
          if (*(char *)(*(long *)(pDVar8 + 0x20) + 0x4b) != '\x01') {
            pDVar8 = FieldDescriptor::message_type(this_00);
            if (*(char *)(*(long *)(pDVar8 + 0x20) + 0x48) == '\0') {
              std::__cxx11::string::string
                        ((string *)&local_a8,"TableStruct",(allocator *)&stack0xfffffffffffffe07);
              pDVar8 = FieldDescriptor::message_type(this_00);
              UniqueName(&local_88,&local_a8,pDVar8,local_210);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &type,"::",&local_88);
              std::operator+(&local_110,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &type,"::serialization_table + ");
              FieldDescriptor::message_type(this_00);
              iVar5 = anon_unknown_0::FindMessageIndexInFile(in_stack_fffffffffffffe00);
              strings::AlphaNum::AlphaNum((AlphaNum *)&serializer,iVar5);
              StrCat_abi_cxx11_(&local_50,(protobuf *)&serializer,a_03);
              std::operator+(&local_d0,&local_110,&local_50);
              std::__cxx11::string::operator=((string *)&ptr,(string *)&local_d0);
              std::__cxx11::string::~string((string *)&local_d0);
              std::__cxx11::string::~string((string *)&local_50);
              std::__cxx11::string::~string((string *)&local_110);
              std::__cxx11::string::~string((string *)&type);
              std::__cxx11::string::~string((string *)&local_88);
              std::__cxx11::string::~string((string *)&local_a8);
            }
            goto LAB_002d873c;
          }
          FieldDescriptor::message_type(this_00);
          iVar5 = anon_unknown_0::FindMessageIndexInFile(in_stack_fffffffffffffe00);
          local_d0._M_dataplus._M_p._0_4_ = iVar5;
          pDVar8 = FieldDescriptor::message_type(this_00);
          QualifiedClassName_abi_cxx11_
                    (&serializer,(cpp *)pDVar8,(Descriptor *)local_210,(Options *)options);
          Formatter::operator()
                    (&format,
                     "{PROTOBUF_FIELD_OFFSET($classtype$, $field_name$_), $1$, $2$, ::$proto_ns$::internal::FieldMetadata::kSpecial, reinterpret_cast<const void*>(static_cast< ::$proto_ns$::internal::SpecialSerializer>(::$proto_ns$::internal::MapFieldSerializer< ::$proto_ns$::internal::MapEntryToMapField<$3$>::MapFieldType, $tablename$::serialization_table>))},\n"
                     ,&tag,(int *)&local_d0,&serializer);
          std::__cxx11::string::~string((string *)&serializer);
        }
        else {
LAB_002d873c:
          pFVar6 = FieldGeneratorMap::get(local_208,this_00);
          type = anon_unknown_0::CalcFieldNum(pFVar6,this_00,local_210);
          bVar2 = IsLazy(this_00,local_210,this->scc_analyzer_);
          if (bVar2) {
            type = 0x69;
            std::__cxx11::string::string((string *)&local_110,"proto_ns",(allocator *)&local_88);
            pmVar7 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](&this->variables_,&local_110);
            std::operator+(&local_d0,"reinterpret_cast<const void*>(::",pmVar7);
            std::operator+(&serializer,&local_d0,"::internal::LazyFieldSerializer");
            std::__cxx11::string::operator=((string *)&ptr,(string *)&serializer);
            std::__cxx11::string::~string((string *)&serializer);
            std::__cxx11::string::~string((string *)&local_d0);
            std::__cxx11::string::~string((string *)&local_110);
            pOVar9 = FieldDescriptor::real_containing_oneof(this_00);
            if ((pOVar9 != (OneofDescriptor *)0x0) || (bVar2 = HasHasbit(this_00), !bVar2)) {
              std::__cxx11::string::append((char *)&ptr);
            }
            std::__cxx11::string::append((char *)&ptr);
          }
          if (*(char *)(*(long *)(this_00 + 0x38) + 0x4f) == '\x01') {
            Formatter::operator()
                      (&format,
                       "{PROTOBUF_FIELD_OFFSET($classtype$, _weak_field_map_), $1$, $1$, ::$proto_ns$::internal::FieldMetadata::kSpecial, reinterpret_cast<const void*>(::$proto_ns$::internal::WeakFieldSerializer)},\n"
                       ,&tag);
          }
          else {
            pOVar9 = FieldDescriptor::real_containing_oneof(this_00);
            if (pOVar9 == (OneofDescriptor *)0x0) {
              bVar2 = HasHasbit(this_00);
              pcVar10 = "{PROTOBUF_FIELD_OFFSET($classtype$, $field_name$_), $1$, ~0u, $2$, $3$},\n"
              ;
              if (bVar2) {
                pcVar10 = "hasbitsoffset";
                std::__cxx11::string::string
                          ((string *)&serializer,"hasbitsoffset",(allocator *)&local_d0);
                pcVar10 = FieldDescriptor::index(this_00,pcVar10,__c);
                Formatter::Set<int>(&format,&serializer,
                                    (this->has_bit_indices_).
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start + (int)pcVar10);
                std::__cxx11::string::~string((string *)&serializer);
                pcVar10 = 
                "{PROTOBUF_FIELD_OFFSET($classtype$, $field_name$_), $1$, PROTOBUF_FIELD_OFFSET($classtype$, _has_bits_) * 8 + $hasbitsoffset$, $2$, $3$},\n"
                ;
              }
            }
            else {
              std::__cxx11::string::string
                        ((string *)&serializer,"oneofoffset",(allocator *)&local_110);
              if (((byte)this_00[1] & 0x10) == 0) {
                lVar13 = 0;
              }
              else {
                lVar13 = *(long *)(this_00 + 0x28);
              }
              local_d0._M_dataplus._M_p =
                   (pointer)((long)(int)((lVar13 - *(long *)(*(long *)(lVar13 + 0x10) + 0x30)) /
                                        0x28) << 2);
              Formatter::Set<unsigned_long>(&format,&serializer,(unsigned_long *)&local_d0);
              std::__cxx11::string::~string((string *)&serializer);
              pcVar10 = 
              "{PROTOBUF_FIELD_OFFSET($classtype$, $field_name$_), $1$, PROTOBUF_FIELD_OFFSET($classtype$, _oneof_case_) + $oneofoffset$, $2$, $3$},\n"
              ;
            }
            Formatter::operator()(&format,pcVar10,&tag,&type,&ptr);
          }
        }
        std::__cxx11::string::~string((string *)&ptr);
        std::__cxx11::string::~string((string *)&vars);
        lVar11 = lVar11 + 1;
      }
      bVar2 = UseUnknownFieldSet(*(FileDescriptor **)(this->descriptor_ + 0x10),local_210);
      pcVar10 = "UnknownFieldSerializerLite";
      if (bVar2) {
        pcVar10 = "UnknownFieldSetSerializer";
      }
      std::__cxx11::string::string((string *)&serializer,pcVar10,(allocator *)&vars);
      Formatter::operator()
                (&format,
                 "{PROTOBUF_FIELD_OFFSET($classtype$, _internal_metadata_), 0, ~0u, ::$proto_ns$::internal::FieldMetadata::kSpecial, reinterpret_cast<const void*>(::$proto_ns$::internal::$1$)},\n"
                 ,&serializer);
      iVar5 = (int)uVar14 + (int)lVar11 + 2;
      std::__cxx11::string::~string((string *)&serializer);
      std::
      _Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
      ::~_Vector_base(&sorted_extensions.
                       super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                     );
    }
    std::
    _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::~_Vector_base(&sorted.
                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   );
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&format.vars_._M_t);
  return iVar5;
}

Assistant:

int MessageGenerator::GenerateFieldMetadata(io::Printer* printer) {
  Formatter format(printer, variables_);
  if (!options_.table_driven_serialization) {
    return 0;
  }

  std::vector<const FieldDescriptor*> sorted = SortFieldsByNumber(descriptor_);
  if (IsMapEntryMessage(descriptor_)) {
    for (int i = 0; i < 2; i++) {
      const FieldDescriptor* field = sorted[i];
      const FieldGenerator& generator = field_generators_.get(field);

      uint32_t tag = internal::WireFormatLite::MakeTag(
          field->number(), WireFormat::WireTypeForFieldType(field->type()));

      std::map<std::string, std::string> vars;
      vars["classtype"] = QualifiedClassName(descriptor_, options_);
      vars["field_name"] = FieldName(field);
      vars["tag"] = StrCat(tag);
      vars["hasbit"] = StrCat(i);
      vars["type"] = StrCat(CalcFieldNum(generator, field, options_));
      vars["ptr"] = "nullptr";
      if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
        GOOGLE_CHECK(!IsMapEntryMessage(field->message_type()));
        vars["ptr"] =
            "::" + UniqueName("TableStruct", field->message_type(), options_) +
            "::serialization_table + " +
            StrCat(FindMessageIndexInFile(field->message_type()));
      }
      Formatter::SaveState saver(&format);
      format.AddMap(vars);
      format(
          "{PROTOBUF_FIELD_OFFSET("
          "::$proto_ns$::internal::MapEntryHelper<$classtype$::"
          "SuperType>, $field_name$_), $tag$,"
          "PROTOBUF_FIELD_OFFSET("
          "::$proto_ns$::internal::MapEntryHelper<$classtype$::"
          "SuperType>, _has_bits_) * 8 + $hasbit$, $type$, "
          "$ptr$},\n");
    }
    return 2;
  }
  format(
      "{PROTOBUF_FIELD_OFFSET($classtype$, _cached_size_),"
      " 0, 0, 0, nullptr},\n");
  std::vector<const Descriptor::ExtensionRange*> sorted_extensions;
  sorted_extensions.reserve(descriptor_->extension_range_count());
  for (int i = 0; i < descriptor_->extension_range_count(); ++i) {
    sorted_extensions.push_back(descriptor_->extension_range(i));
  }
  std::sort(sorted_extensions.begin(), sorted_extensions.end(),
            ExtensionRangeSorter());
  for (int i = 0, extension_idx = 0; /* no range */; i++) {
    for (; extension_idx < sorted_extensions.size() &&
           (i == sorted.size() ||
            sorted_extensions[extension_idx]->start < sorted[i]->number());
         extension_idx++) {
      const Descriptor::ExtensionRange* range =
          sorted_extensions[extension_idx];
      format(
          "{PROTOBUF_FIELD_OFFSET($classtype$, _extensions_), "
          "$1$, $2$, ::$proto_ns$::internal::FieldMetadata::kSpecial, "
          "reinterpret_cast<const "
          "void*>(::$proto_ns$::internal::ExtensionSerializer)},\n",
          range->start, range->end);
    }
    if (i == sorted.size()) break;
    const FieldDescriptor* field = sorted[i];

    uint32_t tag = internal::WireFormatLite::MakeTag(
        field->number(), WireFormat::WireTypeForFieldType(field->type()));
    if (field->is_packed()) {
      tag = internal::WireFormatLite::MakeTag(
          field->number(), WireFormatLite::WIRETYPE_LENGTH_DELIMITED);
    }

    std::string classfieldname = FieldName(field);
    if (field->real_containing_oneof()) {
      classfieldname = field->containing_oneof()->name();
    }
    format.Set("field_name", classfieldname);
    std::string ptr = "nullptr";
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      if (IsMapEntryMessage(field->message_type())) {
        format(
            "{PROTOBUF_FIELD_OFFSET($classtype$, $field_name$_), $1$, $2$, "
            "::$proto_ns$::internal::FieldMetadata::kSpecial, "
            "reinterpret_cast<const void*>(static_cast< "
            "::$proto_ns$::internal::SpecialSerializer>("
            "::$proto_ns$::internal::MapFieldSerializer< "
            "::$proto_ns$::internal::MapEntryToMapField<"
            "$3$>::MapFieldType, "
            "$tablename$::serialization_table>))},\n",
            tag, FindMessageIndexInFile(field->message_type()),
            QualifiedClassName(field->message_type(), options_));
        continue;
      } else if (!field->message_type()->options().message_set_wire_format()) {
        // message_set doesn't have the usual table and we need to
        // dispatch to generated serializer, hence ptr stays zero.
        ptr =
            "::" + UniqueName("TableStruct", field->message_type(), options_) +
            "::serialization_table + " +
            StrCat(FindMessageIndexInFile(field->message_type()));
      }
    }

    const FieldGenerator& generator = field_generators_.get(field);
    int type = CalcFieldNum(generator, field, options_);

    if (IsLazy(field, options_, scc_analyzer_)) {
      type = internal::FieldMetadata::kSpecial;
      ptr = "reinterpret_cast<const void*>(::" + variables_["proto_ns"] +
            "::internal::LazyFieldSerializer";
      if (field->real_containing_oneof()) {
        ptr += "OneOf";
      } else if (!HasHasbit(field)) {
        ptr += "NoPresence";
      }
      ptr += ")";
    }

    if (field->options().weak()) {
      // TODO(gerbens) merge weak fields into ranges
      format(
          "{PROTOBUF_FIELD_OFFSET("
          "$classtype$, _weak_field_map_), $1$, $1$, "
          "::$proto_ns$::internal::FieldMetadata::kSpecial, "
          "reinterpret_cast<const "
          "void*>(::$proto_ns$::internal::WeakFieldSerializer)},\n",
          tag);
    } else if (field->real_containing_oneof()) {
      format.Set("oneofoffset",
                 sizeof(uint32_t) * field->containing_oneof()->index());
      format(
          "{PROTOBUF_FIELD_OFFSET($classtype$, $field_name$_), $1$,"
          " PROTOBUF_FIELD_OFFSET($classtype$, _oneof_case_) + "
          "$oneofoffset$, $2$, $3$},\n",
          tag, type, ptr);
    } else if (HasHasbit(field)) {
      format.Set("hasbitsoffset", has_bit_indices_[field->index()]);
      format(
          "{PROTOBUF_FIELD_OFFSET($classtype$, $field_name$_), "
          "$1$, PROTOBUF_FIELD_OFFSET($classtype$, _has_bits_) * 8 + "
          "$hasbitsoffset$, $2$, $3$},\n",
          tag, type, ptr);
    } else {
      format(
          "{PROTOBUF_FIELD_OFFSET($classtype$, $field_name$_), "
          "$1$, ~0u, $2$, $3$},\n",
          tag, type, ptr);
    }
  }
  int num_field_metadata = 1 + sorted.size() + sorted_extensions.size();
  num_field_metadata++;
  std::string serializer = UseUnknownFieldSet(descriptor_->file(), options_)
                               ? "UnknownFieldSetSerializer"
                               : "UnknownFieldSerializerLite";
  format(
      "{PROTOBUF_FIELD_OFFSET($classtype$, _internal_metadata_), 0, ~0u, "
      "::$proto_ns$::internal::FieldMetadata::kSpecial, reinterpret_cast<const "
      "void*>(::$proto_ns$::internal::$1$)},\n",
      serializer);
  return num_field_metadata;
}